

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

char * cutstring(char **p,int *len)

{
  int iVar1;
  char *end;
  char *pcVar2;
  
  pcVar2 = *p + 1;
  *p = pcVar2;
  end = parsestring(pcVar2);
  pcVar2 = newstring((long)end - (long)pcVar2);
  iVar1 = unescapestring(pcVar2,*p,end);
  *len = iVar1;
  pcVar2[iVar1] = '\0';
  *p = end;
  if (*end == '\"') {
    *p = end + 1;
  }
  return pcVar2;
}

Assistant:

static inline char *cutstring(const char *&p, int &len)
{
    p++;
    const char *end = parsestring(p);
    char *s = newstring(end - p);
    len = unescapestring(s, p, end);
    s[len] = '\0';
    p = end;
    if(*p=='\"') p++;
    return s;
}